

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O3

void increment_day(Date *d)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = d->m;
  if (uVar1 < 0xd) {
    iVar3 = 0x1f;
    if ((0x15aaU >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001025eb;
    if (uVar1 == 2) {
      uVar2 = d->y;
      if (((uVar2 & 3) != 0) ||
         ((iVar3 = 0x1d, (uVar2 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar2 * 0x40000000) < 0x28f5c29 &&
          (uVar2 != ((int)uVar2 / 400) * 400)))) {
        iVar3 = 0x1c;
      }
      goto LAB_001025eb;
    }
  }
  iVar3 = 0x1e;
LAB_001025eb:
  iVar4 = d->d + 1;
  if (d->d == iVar3) {
    iVar4 = 1;
  }
  d->d = iVar4;
  if (iVar4 == 1) {
    iVar3 = uVar1 + 1;
    if (uVar1 == 0xc) {
      iVar3 = 1;
    }
    d->m = iVar3;
    if (iVar3 == 1) {
      d->y = d->y + 1;
    }
  }
  return;
}

Assistant:

void increment_day(Date& d)
{
	switch (d.m)
	{
	case 2:
	{
		if (is_leap(d))
			d.d = next_val(29, d.d);
		else
			d.d = next_val(28, d.d);
		break;
	}
	case 1:
	case 3:
	case 5:
	case 7:
	case 8:
	case 10:
	case 12:
		d.d = next_val(31, d.d);
		break;
	default:
		d.d = next_val(30, d.d);
	}

	// handles case when next day is the first day of next month
	if (d.d == 1)
	{
		d.m = next_val(12, d.m);
		if (d.m == 1)
			++d.y;
	}
}